

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O3

ExprNode * __thiscall Translator::visit(Translator *this,PointerExpNode *pointerExpNode)

{
  int iVar1;
  VarSymbol *pVVar2;
  MEM *this_00;
  BINOP *this_01;
  undefined4 extraout_var;
  ExprNode *right;
  
  pVVar2 = VarTable::cSearch(this->varTable,(pointerExpNode->id->super_ExpNode).lexeme);
  if (pVVar2 == (VarSymbol *)0x0) {
    this_00 = (MEM *)0x0;
  }
  else {
    this_00 = (MEM *)operator_new(0x18);
    this_01 = (BINOP *)operator_new(0x20);
    iVar1 = (*(pointerExpNode->exp->super_StmtNode).super_ASTNode._vptr_ASTNode[4])
                      (pointerExpNode->exp,this);
    right = (ExprNode *)operator_new(0x10);
    CONST::CONST((CONST *)right,pVVar2->offset);
    BINOP::BINOP(this_01,0x2c,(ExprNode *)CONCAT44(extraout_var,iVar1),right);
    MEM::MEM(this_00,(ExprNode *)this_01);
  }
  return &this_00->super_ExprNode;
}

Assistant:

ExprNode *Translator::visit(PointerExpNode *pointerExpNode) {//TODO verificar corretude
    VarSymbol *pointerVar = varTable->cSearch(pointerExpNode->getId()->getLexeme());
    if (pointerVar) {
        // TODO offset ou size?
        return new MEM(new BINOP(PLUS, pointerExpNode->getExp()->accept(this), new CONST(pointerVar->getOffset())));
    } else {
        return NULL;
    }
}